

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O1

NativeWindowFactory *
eglu::selectNativeWindowFactory(NativeDisplayFactory *factory,CommandLine *cmdLine)

{
  NativeWindowFactoryRegistry *this;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  NativeWindowFactory *pNVar4;
  AbstractFactory *pAVar5;
  undefined4 extraout_var;
  FactoryBase *this_00;
  NotSupportedError *pNVar6;
  long *plVar7;
  long *plVar8;
  size_type *psVar9;
  size_t index;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this = &factory->m_nativeWindowRegistry;
  pcVar2 = tcu::CommandLine::getEGLWindowType(cmdLine);
  if (pcVar2 == (char *)0x0) {
    if ((factory->m_nativeWindowRegistry).m_registry.m_factories.
        super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (factory->m_nativeWindowRegistry).m_registry.m_factories.
        super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pNVar4 = (NativeWindowFactory *)
               tcu::GenericFactoryRegistry::getFactoryByIndex(&this->m_registry,0);
      return pNVar4;
    }
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"No factory supporting EGL \'","");
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_b0 = (long *)*plVar7;
    plVar8 = plVar7 + 2;
    if (local_b0 == plVar8) {
      local_a0 = *plVar8;
      lStack_98 = plVar7[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar8;
    }
    local_a8 = plVar7[1];
    *plVar7 = (long)plVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_d0._M_dataplus._M_p = (pointer)*plVar7;
    psVar9 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_d0._M_dataplus._M_p == psVar9) {
      local_d0.field_2._M_allocated_capacity = *psVar9;
      local_d0.field_2._8_8_ = plVar7[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar9;
    }
    local_d0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::NotSupportedError::NotSupportedError
              (pNVar6,local_d0._M_dataplus._M_p,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
               ,0x1ce);
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  sVar3 = strlen(pcVar2);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,pcVar2,pcVar2 + sVar3);
  pNVar4 = (NativeWindowFactory *)
           tcu::GenericFactoryRegistry::getFactoryByName(&this->m_registry,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (pNVar4 != (NativeWindowFactory *)0x0) {
    return pNVar4;
  }
  tcu::print("ERROR: Unknown or unsupported EGL %s type \'%s\'","window",pcVar2);
  tcu::print("Available EGL %s types:\n","window");
  if ((factory->m_nativeWindowRegistry).m_registry.m_factories.
      super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (factory->m_nativeWindowRegistry).m_registry.m_factories.
      super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    index = 0;
    do {
      pAVar5 = tcu::GenericFactoryRegistry::getFactoryByIndex(&this->m_registry,index);
      iVar1 = (*pAVar5->_vptr_AbstractFactory[2])(pAVar5);
      this_00 = (FactoryBase *)
                tcu::GenericFactoryRegistry::getFactoryByIndex(&this->m_registry,index);
      pcVar2 = tcu::FactoryBase::getDescription(this_00);
      tcu::print("  %s: %s\n",CONCAT44(extraout_var,iVar1),pcVar2);
      index = index + 1;
    } while (index < (ulong)((long)(factory->m_nativeWindowRegistry).m_registry.m_factories.
                                   super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(factory->m_nativeWindowRegistry).m_registry.m_factories.
                                   super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"Unsupported or unknown EGL ","");
  plVar7 = (long *)std::__cxx11::string::append((char *)local_50);
  local_70 = (long *)*plVar7;
  plVar8 = plVar7 + 2;
  if (local_70 == plVar8) {
    local_60 = *plVar8;
    lStack_58 = plVar7[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar8;
  }
  local_68 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_90 = (long *)*plVar7;
  plVar8 = plVar7 + 2;
  if (local_90 == plVar8) {
    local_80 = *plVar8;
    lStack_78 = plVar7[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar8;
  }
  local_88 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_b0 = (long *)*plVar7;
  plVar8 = plVar7 + 2;
  if (local_b0 == plVar8) {
    local_a0 = *plVar8;
    lStack_98 = plVar7[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar8;
  }
  local_a8 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_d0._M_dataplus._M_p = (pointer)*plVar7;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((size_type *)local_d0._M_dataplus._M_p == psVar9) {
    local_d0.field_2._M_allocated_capacity = *psVar9;
    local_d0.field_2._8_8_ = plVar7[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar9;
  }
  local_d0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  tcu::NotSupportedError::NotSupportedError
            (pNVar6,local_d0._M_dataplus._M_p,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
             ,0x1c8);
  __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

const NativeWindowFactory& selectNativeWindowFactory (const NativeDisplayFactory& factory, const tcu::CommandLine& cmdLine)
{
	return selectFactory(factory.getNativeWindowRegistry(), "window", cmdLine.getEGLWindowType());
}